

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

void __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::draw
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint layer,
          ShaderProgram *program)

{
  long lVar1;
  allocator<char> local_319;
  string local_318;
  GLuint indices [6];
  GLfloat texCoord1D [4];
  VertexArrayBinding vertexArrays [2];
  GLfloat texCoord2D [8];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1e0;
  VertexArrayPointer local_1d8;
  GLfloat vertices [12];
  GLfloat texCoord3D [12];
  GLfloat texCoordCubeMap [6] [12];
  
  texCoord1D[0] = 0.0;
  texCoord1D[1] = 1.0;
  texCoord1D[2] = 0.0;
  texCoord1D[3] = 1.0;
  texCoord2D[4] = 0.0;
  texCoord2D[5] = 1.0;
  texCoord2D[6] = 1.0;
  texCoord2D[7] = 1.0;
  texCoord2D[0] = 0.0;
  texCoord2D[1] = 0.0;
  texCoord2D[2] = 1.0;
  texCoord2D[3] = 0.0;
  texCoord3D[8] = 0.5;
  texCoord3D[9] = 1.0;
  texCoord3D[10] = 1.0;
  texCoord3D[0xb] = 0.5;
  texCoord3D[4] = 0.0;
  texCoord3D[5] = 0.5;
  texCoord3D[6] = 0.0;
  texCoord3D[7] = 1.0;
  texCoord3D[0] = 0.0;
  texCoord3D[1] = 0.0;
  texCoord3D[2] = 0.5;
  texCoord3D[3] = 1.0;
  memcpy(texCoordCubeMap,&DAT_01706bd0,0x120);
  vertices[8] = 0.0;
  vertices[9] = 1.0;
  vertices[10] = 1.0;
  vertices[0xb] = 0.0;
  vertices[4] = -1.0;
  vertices[5] = 0.0;
  vertices[6] = -1.0;
  vertices[7] = 1.0;
  vertices[0] = -1.0;
  vertices[1] = -1.0;
  vertices[2] = 0.0;
  vertices[3] = 1.0;
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 1;
  indices[4] = 2;
  indices[5] = 3;
  local_208._0_4_ = TYPE_LAST;
  local_200._M_p = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_1e0 = 0;
  local_1d8.componentType = VTX_COMP_TYPE_LAST;
  local_1d8.convert = VTX_COMP_CONVERT_LAST;
  local_1d8.numComponents = 0;
  local_1d8.numElements = 0;
  local_1d8.stride = 0;
  local_1d8.data = (void *)0x0;
  if (target != 0x8c18) {
    if (target == 0x806f) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"inCoord",&local_319);
      glu::va::Float(vertexArrays,&local_318,3,4,0,texCoord3D);
      goto LAB_00ae254c;
    }
    if (target == 0x8513) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"inCoord",&local_319);
      glu::va::Float(vertexArrays,&local_318,3,4,0,texCoordCubeMap[layer]);
      goto LAB_00ae254c;
    }
    if (target != 0xde0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"inCoord",&local_319);
      glu::va::Float(vertexArrays,&local_318,2,4,0,texCoord2D);
      goto LAB_00ae254c;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"inCoord",&local_319);
  glu::va::Float(vertexArrays,&local_318,1,4,0,texCoord1D);
LAB_00ae254c:
  glu::VertexArrayBinding::operator=((VertexArrayBinding *)local_208,vertexArrays);
  std::__cxx11::string::~string((string *)&vertexArrays[0].binding.name);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"vertex",&local_319);
  glu::va::Float(vertexArrays,&local_318,3,4,0,vertices);
  glu::VertexArrayBinding::VertexArrayBinding(vertexArrays + 1,(VertexArrayBinding *)local_208);
  std::__cxx11::string::~string((string *)&local_318);
  local_318._M_dataplus._M_p = &DAT_600000001;
  local_318._M_string_length._0_4_ = 2;
  local_318.field_2._M_allocated_capacity = (size_type)indices;
  glu::draw(((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx,
            (program->m_program).m_program,2,vertexArrays,(PrimitiveList *)&local_318,
            (DrawUtilCallback *)0x0);
  lVar1 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar1));
    lVar1 = lVar1 + -0x50;
  } while (lVar1 != -0x48);
  std::__cxx11::string::~string((string *)&local_200);
  return;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::draw(GLint target, GLint layer, const ShaderProgram& program)
{
	const GLfloat texCoord1D[] = { 0.0f, 1.0f, 0.0f, 1.0f };

	const GLfloat texCoord2D[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat texCoord3D[] = { 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f };

	const GLfloat texCoordCubeMap[6][12] = {
		{ 0.0f, 0.0f, 0.00f, 1.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f },
		{ 0.0f, 0.0f, 0.17f, 1.0f, 0.0f, 0.17f, 0.0f, 1.0f, 0.17f, 1.0f, 1.0f, 0.17f },
		{ 0.0f, 0.0f, 0.33f, 1.0f, 0.0f, 0.33f, 0.0f, 1.0f, 0.33f, 1.0f, 1.0f, 0.33f },
		{ 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f },
		{ 0.0f, 0.0f, 0.67f, 1.0f, 0.0f, 0.67f, 0.0f, 1.0f, 0.67f, 1.0f, 1.0f, 0.67f },
		{ 0.0f, 0.0f, 0.83f, 1.0f, 0.0f, 0.83f, 0.0f, 1.0f, 0.83f, 1.0f, 1.0f, 0.83f }
	};

	const GLfloat vertices[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indices[] = { 0, 1, 2, 1, 2, 3 };

	VertexArrayBinding floatCoord;

	if (target == GL_TEXTURE_1D || target == GL_TEXTURE_1D_ARRAY)
		floatCoord = glu::va::Float("inCoord", 1, 4, 0, texCoord1D);
	else if (target == GL_TEXTURE_3D)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoord3D);
	else if (target == GL_TEXTURE_CUBE_MAP)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoordCubeMap[layer]);
	else
		floatCoord = glu::va::Float("inCoord", 2, 4, 0, texCoord2D);

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices), floatCoord };

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));
}